

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O1

int uv__getsockpeername(uv_handle_t *handle,uv__peersockfunc func,sockaddr *name,int *namelen)

{
  int iVar1;
  int *piVar2;
  uv_os_fd_t fd;
  socklen_t socklen;
  int local_20;
  socklen_t local_1c;
  
  iVar1 = uv_fileno(handle,&local_20);
  if (-1 < iVar1) {
    local_1c = *namelen;
    iVar1 = (*func)(local_20,name,&local_1c);
    if (iVar1 == 0) {
      *namelen = local_1c;
      iVar1 = 0;
    }
    else {
      piVar2 = __errno_location();
      iVar1 = -*piVar2;
    }
  }
  return iVar1;
}

Assistant:

int uv__getsockpeername(const uv_handle_t* handle,
                        uv__peersockfunc func,
                        struct sockaddr* name,
                        int* namelen) {
  socklen_t socklen;
  uv_os_fd_t fd;
  int r;

  r = uv_fileno(handle, &fd);
  if (r < 0)
    return r;

  /* sizeof(socklen_t) != sizeof(int) on some systems. */
  socklen = (socklen_t) *namelen;

  if (func(fd, name, &socklen))
    return UV__ERR(errno);

  *namelen = (int) socklen;
  return 0;
}